

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

float ImGui::ScaleRatioFromValueT<unsigned_int,int,float>
                (ImGuiDataType data_type,uint v,uint v_min,uint v_max,bool is_logarithmic,
                float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  undefined1 in_register_00001204 [60];
  undefined1 auVar9 [64];
  undefined1 in_ZMM2 [64];
  float fVar10;
  undefined1 in_XMM4 [16];
  
  auVar9._4_60_ = in_register_00001204;
  auVar9._0_4_ = logarithmic_zero_epsilon;
  fVar7 = 0.0;
  iVar3 = v_max - v_min;
  if (iVar3 != 0) {
    uVar6 = v_max;
    if (v_max >= v_min && iVar3 != 0) {
      uVar6 = v_min;
    }
    uVar5 = v_max;
    if (v_max < v_min) {
      uVar5 = v_min;
    }
    if (v < uVar5) {
      uVar5 = v;
    }
    if (v < uVar6) {
      uVar5 = uVar6;
    }
    if (is_logarithmic) {
      uVar6 = v_min;
      if (v_max < v_min) {
        uVar6 = v_max;
      }
      uVar4 = v_min;
      if (v_min < v_max) {
        uVar4 = v_max;
      }
      auVar1 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,uVar6);
      auVar1 = vmaxss_avx(auVar9._0_16_,auVar1);
      auVar2 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,uVar5);
      fVar7 = 0.0;
      fVar10 = auVar1._0_4_;
      fVar8 = auVar2._0_4_;
      if (fVar10 < fVar8) {
        auVar1 = vcvtusi2ss_avx512f(in_XMM4,uVar4);
        auVar1 = vmaxss_avx(auVar9._0_16_,auVar1);
        if (auVar1._0_4_ <= fVar8) {
          fVar7 = 1.0;
        }
        else {
          fVar7 = logf(fVar8 / fVar10);
          fVar8 = logf(auVar1._0_4_ / fVar10);
          fVar7 = fVar7 / fVar8;
        }
      }
      fVar7 = (float)((uint)(v_max < v_min) * (int)(1.0 - fVar7) +
                     (uint)(v_max >= v_min) * (int)fVar7);
    }
    else {
      fVar7 = (float)(int)(uVar5 - v_min) / (float)iVar3;
    }
  }
  return fVar7;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}